

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O0

void inject(args *t,stateRecord *state)

{
  node *parent_00;
  node *p_00;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  node *newChild;
  __pointer_type p_01;
  node *temp;
  bool p;
  bool d;
  bool i;
  bool result;
  size_t which;
  edge targetEdge;
  node *node;
  node *parent;
  stateRecord *state_local;
  args *t_local;
  
  parent_00 = (state->targetEdge).parent;
  p_00 = (state->targetEdge).child;
  targetEdge.child = *(node **)&(state->targetEdge).which;
  bVar1 = (byte)targetEdge.child & 1;
  which = (size_t)parent_00;
  targetEdge.parent = p_00;
  targetEdge._16_8_ = p_00;
  newChild = setIFlag(p_00);
  bVar2 = CAS(parent_00,(ulong)bVar1,p_00,newChild);
  if (bVar2) {
    bVar2 = markChildEdge(t,state,false);
    if (bVar2) {
      markChildEdge(t,state,true);
      initializeTypeAndUpdateMode(t,state);
    }
  }
  else {
    p_01 = std::atomic::operator_cast_to_node_((atomic *)(parent_00->child + bVar1));
    bVar2 = IFlagSet(p_01);
    bVar3 = DFlagSet(p_01);
    bVar4 = PFlagSet(p_01);
    if (bVar2) {
      helpTargetNode(t,(edge *)&which,1);
    }
    else if (bVar3) {
      helpTargetNode(t,&state->pTargetEdge,1);
    }
    else if (bVar4) {
      helpSuccessorNode(t,&state->pTargetEdge,1);
    }
  }
  return;
}

Assistant:

void inject(struct args* t,struct stateRecord* state)
{
    struct node* parent;
    struct node* node;
    struct edge targetEdge;
    size_t which;
    bool result;
    bool i,d,p;
    struct node* temp;

    targetEdge = state->targetEdge;
    parent = targetEdge.parent;
    node = targetEdge.child;
    which = targetEdge.which;

    result = CAS(parent,which,node,setIFlag(node));
    if(!result)
    {
        temp = parent->child[which];
        i=IFlagSet(temp);
        d=DFlagSet(temp);
        p=PFlagSet(temp);

        if(i)
        {
            helpTargetNode(t,&targetEdge,1);
        }
        else if(d)
        {
            helpTargetNode(t,&state->pTargetEdge,1);
        }
        else if(p)
        {
            helpSuccessorNode(t,&state->pTargetEdge,1);
        }
        return;
    }

    result = markChildEdge(t,state,LC);
    if(!result)
    {
        return;
    }
    result = markChildEdge(t,state,RC);

    initializeTypeAndUpdateMode(t,state);
    return;
}